

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

int __thiscall asl::Array<char>::dup(Array<char> *this,int __fd)

{
  int in_ECX;
  void *in_RDX;
  void *in_R8;
  Array<char> AStack_18;
  
  if (*(int *)(this->_a + -8) != 1) {
    clone(&AStack_18,(__fn *)this,in_RDX,in_ECX,in_R8);
    this = operator=(this,&AStack_18);
    ~Array(&AStack_18);
  }
  return (int)this;
}

Assistant:

Array& dup()
	{
		if(d().rc==1) return *this;
		return (*this = clone());
	}